

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
DecPOMDPDiscrete::DecPOMDPDiscrete(DecPOMDPDiscrete *this,string *name,string *descr,string *pf)

{
  *(undefined ***)&this->field_0x220 = &PTR__POSGInterface_00612968;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)&this->field_0x220,&PTR_PTR_00611a30);
  *(undefined8 *)&this->field_0x228 = 0x612b50;
  *(undefined8 *)&this->field_0x220 = 0x612d00;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)&this->field_0x220,&PTR_construction_vtable_232__00611a08)
  ;
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (&this->super_MultiAgentDecisionProcessDiscrete,&PTR_construction_vtable_72__00611990,
             name,descr,pf);
  DecPOMDP::DecPOMDP((DecPOMDP *)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200,
                     &PTR_construction_vtable_176__006119b8);
  *(undefined8 *)&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess =
       0x6111b8;
  *(undefined8 *)&this->field_0x220 = 0x6115b8;
  *(undefined8 *)&this->field_0x228 = 0x611810;
  *(undefined8 *)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 = 0x611430;
  this->_m_initialized = false;
  this->_m_p_rModel = (RewardModel *)0x0;
  return;
}

Assistant:

DecPOMDPDiscrete::DecPOMDPDiscrete(const string &name,
                                   const string &descr,
                                   const string &pf) :
    MultiAgentDecisionProcessDiscrete(name, descr, pf)
{
    _m_initialized = false;
    _m_p_rModel = 0;
}